

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a28a9::BNTest_ASN1_Test::TestBody(BNTest_ASN1_Test *this)

{
  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> _Var1;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var2;
  CBB *pCVar3;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var4;
  bool bVar5;
  int iVar6;
  UniquePtr<BIGNUM> UVar7;
  ScopedTrace *this_00;
  char *pcVar8;
  _Head_base<0UL,_bignum_st_*,_false> in_R9;
  long lVar9;
  ScopedTrace gtest_trace_1423;
  UniquePtr<BIGNUM> bn;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  Bytes local_c8;
  UniquePtr<BIGNUM> bn_1;
  AssertionResult gtest_ar_;
  CBS cbs;
  UniquePtr<BIGNUM> bn2;
  UniquePtr<uint8_t> delete_der;
  ScopedCBB cbb;
  size_t der_len;
  uint8_t *der;
  
  lVar9 = 0x10;
  do {
    if (lVar9 == 0xb8) {
      lVar9 = 8;
      while( true ) {
        if (lVar9 == 0x58) {
          ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&bn,"-1");
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
               bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
              bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&cbs);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&cbb,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false",
                       "true",(char *)in_R9._M_head_impl);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x5b4,(char *)cbb.ctx_.child);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&cbs);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
            std::__cxx11::string::~string((string *)&cbb);
            if (cbs.data != (uint8_t *)0x0) {
              (**(code **)(*(long *)cbs.data + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            CBB_zero(&cbb.ctx_);
            iVar6 = CBB_init(&cbb.ctx_,0);
            cbs.len = 0;
            cbs.data = (uint8_t *)CONCAT71(cbs.data._1_7_,iVar6 != 0);
            if (iVar6 == 0) {
              testing::Message::Message((Message *)&local_c8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_,(internal *)&cbs,
                         (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",
                         (char *)in_R9._M_head_impl);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&bn_1,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x5b6,(char *)gtest_ar_._0_8_);
              testing::internal::AssertHelper::operator=((AssertHelper *)&bn_1,(Message *)&local_c8)
              ;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bn_1);
              std::__cxx11::string::~string((string *)&gtest_ar_);
              if ((long *)local_c8.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_c8.span_.data_ + 8))();
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cbs.len);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cbs.len);
              iVar6 = BN_marshal_asn1(&cbb.ctx_,
                                      (BIGNUM *)
                                      bn._M_t.
                                      super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t
                                      .super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
              cbs.len = 0;
              cbs.data = (uint8_t *)CONCAT71(cbs.data._1_7_,iVar6 == 0);
              if (iVar6 != 0) {
                testing::Message::Message((Message *)&local_c8);
                std::operator<<((ostream *)((long)local_c8.span_.data_ + 0x10),
                                "Serialized negative number.");
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_,(internal *)&cbs,
                           (AssertionResult *)"BN_marshal_asn1(cbb.get(), bn.get())","true","false",
                           (char *)in_R9._M_head_impl);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&bn_1,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x5b7,(char *)gtest_ar_._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&bn_1,(Message *)&local_c8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bn_1);
                std::__cxx11::string::~string((string *)&gtest_ar_);
                if ((long *)local_c8.span_.data_ != (long *)0x0) {
                  (**(code **)(*(long *)local_c8.span_.data_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&cbs.len);
              ERR_clear_error();
            }
            bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                      (&cbb);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn);
          return;
        }
        pCVar3 = *(CBB **)(&UNK_006817a8 + lVar9);
        _Var4._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&(anonymous_namespace)::kASN1InvalidTests + lVar9))->_M_t;
        cbb.ctx_.child = pCVar3;
        cbb.ctx_._8_8_ = _Var4;
        testing::ScopedTrace::ScopedTrace<Bytes>
                  ((ScopedTrace *)&bn2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a8,(Bytes *)&cbb);
        bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        bVar5 = (tuple<bignum_st_*,_bssl::internal::Deleter>)
                bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                (_Head_base<0UL,_bignum_st_*,_false>)0x0;
        gtest_ar_.success_ = bVar5;
        if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
            bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_bignum_st_*,_false>)0x0) break;
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_._0_8_ = pCVar3;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )_Var4;
        iVar6 = BN_parse_asn1_unsigned
                          ((CBS *)&gtest_ar_,
                           (BIGNUM *)
                           bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
        cbs.len = 0;
        cbs.data = (uint8_t *)CONCAT71(cbs.data._1_7_,iVar6 == 0);
        if (iVar6 != 0) {
          testing::Message::Message((Message *)&local_c8);
          std::operator<<((ostream *)((long)local_c8.span_.data_ + 0x10),"Parsed invalid input.");
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&cbb,(internal *)&cbs,
                     (AssertionResult *)"BN_parse_asn1_unsigned(&cbs, bn.get())","true","false",
                     (char *)in_R9._M_head_impl);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&bn_1,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x5ad,(char *)cbb.ctx_.child);
          testing::internal::AssertHelper::operator=((AssertHelper *)&bn_1,(Message *)&local_c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bn_1);
          std::__cxx11::string::~string((string *)&cbb);
          if ((long *)local_c8.span_.data_ != (long *)0x0) {
            (**(code **)(*(long *)local_c8.span_.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&cbs.len);
        ERR_clear_error();
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn);
        testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&bn2);
        lVar9 = lVar9 + 0x10;
      }
      testing::Message::Message((Message *)&cbs);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbb,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5aa,(char *)cbb.ctx_.child);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&cbs);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
      std::__cxx11::string::~string((string *)&cbb);
      if (cbs.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)cbs.data + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn);
      this_00 = (ScopedTrace *)&bn2;
LAB_0027dfdb:
      testing::ScopedTrace::~ScopedTrace(this_00);
      return;
    }
    pcVar8 = *(char **)((long)&PTR_typeinfo_006816f0 + lVar9);
    testing::ScopedTrace::ScopedTrace
              (&gtest_trace_1423,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x58f,pcVar8);
    ASCIIToBIGNUM((anon_unknown_dwarf_3a28a9 *)&bn_1,pcVar8);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    bVar5 = (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
            bn_1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
    gtest_ar_.success_ = bVar5;
    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
        bn_1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&cbs);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbb,(internal *)&gtest_ar_,(AssertionResult *)0x4b65fc,"false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bn,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x591,(char *)cbb.ctx_.child);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bn,(Message *)&cbs);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bn);
      std::__cxx11::string::~string((string *)&cbb);
      if (cbs.data != (uint8_t *)0x0) {
        (**(code **)(*(long *)cbs.data + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
LAB_0027dfcc:
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn_1);
      this_00 = &gtest_trace_1423;
      goto LAB_0027dfdb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    bn2._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (tuple<bignum_st_*,_bssl::internal::Deleter>)
         bn2._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_bignum_st_*,_false>)0x0;
    if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
        bn2._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&cbs);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbb,(internal *)&gtest_ar_,(AssertionResult *)"bn2","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bn,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x595,(char *)cbb.ctx_.child);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bn,(Message *)&cbs);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bn);
      std::__cxx11::string::~string((string *)&cbb);
      UVar7._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)cbs.data;
LAB_0027dfad:
      if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
          UVar7._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
          (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
        (**(code **)(*(long *)UVar7._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn2);
      goto LAB_0027dfcc;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    _Var1._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> *)(&UNK_006816f8 + lVar9))->_M_t;
    _Var2.
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&(anonymous_namespace)::kASN1Tests + lVar9))->
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ;
    cbs.data = (uint8_t *)_Var1;
    cbs.len = (size_t)_Var2;
    iVar6 = BN_parse_asn1_unsigned
                      (&cbs,(BIGNUM *)
                            bn2._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar6 != 0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&bn);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&cbb,(internal *)&gtest_ar_,
                 (AssertionResult *)"BN_parse_asn1_unsigned(&cbs, bn2.get())","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x598,(char *)cbb.ctx_.child);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&bn);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
      std::__cxx11::string::~string((string *)&cbb);
      UVar7 = bn;
      goto LAB_0027dfad;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         ((ulong)bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl & 0xffffffff00000000);
    gtest_ar_._0_8_ = cbs.len;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&cbb,"0u","CBS_len(&cbs)",(uint *)&bn,(unsigned_long *)&gtest_ar_);
    if ((char)cbb.ctx_.child == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar8 = "";
      if (cbb.ctx_._8_8_ != 0) {
        pcVar8 = *(char **)cbb.ctx_._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bn,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x599,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bn,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bn);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cbb.ctx_.is_child);
    in_R9._M_head_impl = (bignum_st *)bn2;
    AssertBIGNUMSEqual((char *)&cbb,"bn.get()","bn2.get()","decode ASN.1",
                       (BIGNUM *)
                       bn_1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                       (BIGNUM *)
                       bn2._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
    if ((char)cbb.ctx_.child == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar8 = "";
      if (cbb.ctx_._8_8_ != 0) {
        pcVar8 = *(char **)cbb.ctx_._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bn,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x59a,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bn,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bn);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cbb.ctx_.is_child);
    CBB_zero(&cbb.ctx_);
    iVar6 = CBB_init(&cbb.ctx_,0);
    local_d0._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_1_ = iVar6 != 0;
    if (iVar6 == 0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&bn,(AssertionResult *)"CBB_init(cbb.get(), 0)",
                 "false","true",(char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&delete_der,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5a0,(char *)gtest_ar_._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&delete_der,(Message *)&local_c8);
LAB_0027dc71:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&delete_der);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if ((long *)local_c8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_c8.span_.data_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_d0);
      bVar5 = false;
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_d0);
      iVar6 = BN_marshal_asn1(&cbb.ctx_,
                              (BIGNUM *)
                              bn_1._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
      local_d0._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_1_ = iVar6 != 0;
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&bn,
                   (AssertionResult *)"BN_marshal_asn1(cbb.get(), bn.get())","false","true",
                   (char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&delete_der,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a1,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&delete_der,(Message *)&local_c8)
        ;
        goto LAB_0027dc71;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_d0);
      iVar6 = CBB_finish(&cbb.ctx_,&der,&der_len);
      local_d0._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl._0_1_ = iVar6 != 0;
      if (iVar6 == 0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&bn,
                   (AssertionResult *)"CBB_finish(cbb.get(), &der, &der_len)","false","true",
                   (char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&delete_der,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a2,(char *)gtest_ar_._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&delete_der,(Message *)&local_c8)
        ;
        goto LAB_0027dc71;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_d0);
      delete_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)der;
      local_c8.span_.data_ = der;
      local_c8.span_.size_ = der_len;
      bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)_Var1;
      local_d0._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )_Var2;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&gtest_ar_,"Bytes(test.der, test.der_len)","Bytes(der, der_len)",
                 (Bytes *)&bn,&local_c8);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&bn);
        pcVar8 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar8 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a4,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&bn);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
        if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
            bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)bn._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&delete_der);
      bVar5 = true;
    }
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn2);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&bn_1);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1423);
    lVar9 = lVar9 + 0x18;
    if (!bVar5) {
      return;
    }
  } while( true );
}

Assistant:

TEST_F(BNTest, ASN1) {
  for (const ASN1Test &test : kASN1Tests) {
    SCOPED_TRACE(test.value_ascii);
    bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM(test.value_ascii);
    ASSERT_TRUE(bn);

    // Test that the input is correctly parsed.
    bssl::UniquePtr<BIGNUM> bn2(BN_new());
    ASSERT_TRUE(bn2);
    CBS cbs;
    CBS_init(&cbs, reinterpret_cast<const uint8_t *>(test.der), test.der_len);
    ASSERT_TRUE(BN_parse_asn1_unsigned(&cbs, bn2.get()));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_BIGNUMS_EQUAL("decode ASN.1", bn.get(), bn2.get());

    // Test the value serializes correctly.
    bssl::ScopedCBB cbb;
    uint8_t *der;
    size_t der_len;
    ASSERT_TRUE(CBB_init(cbb.get(), 0));
    ASSERT_TRUE(BN_marshal_asn1(cbb.get(), bn.get()));
    ASSERT_TRUE(CBB_finish(cbb.get(), &der, &der_len));
    bssl::UniquePtr<uint8_t> delete_der(der);
    EXPECT_EQ(Bytes(test.der, test.der_len), Bytes(der, der_len));
  }

  for (const ASN1InvalidTest &test : kASN1InvalidTests) {
    SCOPED_TRACE(Bytes(test.der, test.der_len));
    bssl::UniquePtr<BIGNUM> bn(BN_new());
    ASSERT_TRUE(bn);
    CBS cbs;
    CBS_init(&cbs, reinterpret_cast<const uint8_t *>(test.der), test.der_len);
    EXPECT_FALSE(BN_parse_asn1_unsigned(&cbs, bn.get()))
        << "Parsed invalid input.";
    ERR_clear_error();
  }

  // Serializing negative numbers is not supported.
  bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM("-1");
  ASSERT_TRUE(bn);
  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  EXPECT_FALSE(BN_marshal_asn1(cbb.get(), bn.get()))
      << "Serialized negative number.";
  ERR_clear_error();
}